

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O2

String * cm::operator+=(String *s,
                       StringOpPlus<const_cm::StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>_>
                       *a)

{
  string r;
  string local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&local_30);
  std::__cxx11::string::assign((char *)&local_30,(ulong)(s->view_)._M_str);
  operator+=(&local_30,a->l);
  std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)&local_30,&a->r);
  String::operator=(s,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return s;
}

Assistant:

String& operator+=(String& s, StringOpPlus<L, R> const& a)
{
  std::string r;
  r.reserve(s.size() + a.size());
  r.assign(s.data(), s.size());
  r += a.l;
  r += a.r;
  s = std::move(r);
  return s;
}